

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void V_InitCustomFonts(void)

{
  bool bVar1;
  int iVar2;
  FTexture *pFVar3;
  FFont *this;
  char *pcVar4;
  char *nametemplate;
  FSpecialFont *this_00;
  byte local_aa2;
  FFont *fnt_1;
  FFont *fnt;
  FTexture **ppFStack_a58;
  FTextureID texid;
  FTexture **p;
  int local_a48;
  int iStack_a44;
  char cursor;
  int spacewidth;
  int count;
  int first;
  int start;
  int format;
  int lastlump;
  int llump;
  int i;
  FString templatebuf;
  FString local_a10;
  FString namebuffer;
  bool notranslate [256];
  FTexture *lumplist [256];
  FScanner sc;
  
  FScanner::FScanner((FScanner *)(lumplist + 0xff));
  FString::FString(&local_a10);
  FString::FString((FString *)&llump);
  start = 0;
  p._7_1_ = '_';
  do {
    format = FWadCollection::FindLump(&Wads,"FONTDEFS",&start,false);
    if (format == -1) {
LAB_0066a9a9:
      FString::~FString((FString *)&llump);
      FString::~FString(&local_a10);
      FScanner::~FScanner((FScanner *)(lumplist + 0xff));
      return;
    }
    FScanner::OpenLumpNum((FScanner *)(lumplist + 0xff),format);
    while (bVar1 = FScanner::GetString((FScanner *)(lumplist + 0xff)), bVar1) {
      memset(notranslate + 0xf8,0,0x800);
      notranslate[0xe8] = false;
      notranslate[0xe9] = false;
      notranslate[0xea] = false;
      notranslate[0xeb] = false;
      notranslate[0xec] = false;
      notranslate[0xed] = false;
      notranslate[0xee] = false;
      notranslate[0xef] = false;
      notranslate[0xf0] = false;
      notranslate[0xf1] = false;
      notranslate[0xf2] = false;
      notranslate[0xf3] = false;
      notranslate[0xf4] = false;
      notranslate[0xf5] = false;
      notranslate[0xf6] = false;
      notranslate[0xf7] = false;
      notranslate[0xd8] = false;
      notranslate[0xd9] = false;
      notranslate[0xda] = false;
      notranslate[0xdb] = false;
      notranslate[0xdc] = false;
      notranslate[0xdd] = false;
      notranslate[0xde] = false;
      notranslate[0xdf] = false;
      notranslate[0xe0] = false;
      notranslate[0xe1] = false;
      notranslate[0xe2] = false;
      notranslate[0xe3] = false;
      notranslate[0xe4] = false;
      notranslate[0xe5] = false;
      notranslate[0xe6] = false;
      notranslate[0xe7] = false;
      notranslate[200] = false;
      notranslate[0xc9] = false;
      notranslate[0xca] = false;
      notranslate[0xcb] = false;
      notranslate[0xcc] = false;
      notranslate[0xcd] = false;
      notranslate[0xce] = false;
      notranslate[0xcf] = false;
      notranslate[0xd0] = false;
      notranslate[0xd1] = false;
      notranslate[0xd2] = false;
      notranslate[0xd3] = false;
      notranslate[0xd4] = false;
      notranslate[0xd5] = false;
      notranslate[0xd6] = false;
      notranslate[0xd7] = false;
      notranslate[0xb8] = false;
      notranslate[0xb9] = false;
      notranslate[0xba] = false;
      notranslate[0xbb] = false;
      notranslate[0xbc] = false;
      notranslate[0xbd] = false;
      notranslate[0xbe] = false;
      notranslate[0xbf] = false;
      notranslate[0xc0] = false;
      notranslate[0xc1] = false;
      notranslate[0xc2] = false;
      notranslate[0xc3] = false;
      notranslate[0xc4] = false;
      notranslate[0xc5] = false;
      notranslate[0xc6] = false;
      notranslate[199] = false;
      notranslate[0xa8] = false;
      notranslate[0xa9] = false;
      notranslate[0xaa] = false;
      notranslate[0xab] = false;
      notranslate[0xac] = false;
      notranslate[0xad] = false;
      notranslate[0xae] = false;
      notranslate[0xaf] = false;
      notranslate[0xb0] = false;
      notranslate[0xb1] = false;
      notranslate[0xb2] = false;
      notranslate[0xb3] = false;
      notranslate[0xb4] = false;
      notranslate[0xb5] = false;
      notranslate[0xb6] = false;
      notranslate[0xb7] = false;
      notranslate[0x98] = false;
      notranslate[0x99] = false;
      notranslate[0x9a] = false;
      notranslate[0x9b] = false;
      notranslate[0x9c] = false;
      notranslate[0x9d] = false;
      notranslate[0x9e] = false;
      notranslate[0x9f] = false;
      notranslate[0xa0] = false;
      notranslate[0xa1] = false;
      notranslate[0xa2] = false;
      notranslate[0xa3] = false;
      notranslate[0xa4] = false;
      notranslate[0xa5] = false;
      notranslate[0xa6] = false;
      notranslate[0xa7] = false;
      notranslate[0x88] = false;
      notranslate[0x89] = false;
      notranslate[0x8a] = false;
      notranslate[0x8b] = false;
      notranslate[0x8c] = false;
      notranslate[0x8d] = false;
      notranslate[0x8e] = false;
      notranslate[0x8f] = false;
      notranslate[0x90] = false;
      notranslate[0x91] = false;
      notranslate[0x92] = false;
      notranslate[0x93] = false;
      notranslate[0x94] = false;
      notranslate[0x95] = false;
      notranslate[0x96] = false;
      notranslate[0x97] = false;
      notranslate[0x78] = false;
      notranslate[0x79] = false;
      notranslate[0x7a] = false;
      notranslate[0x7b] = false;
      notranslate[0x7c] = false;
      notranslate[0x7d] = false;
      notranslate[0x7e] = false;
      notranslate[0x7f] = false;
      notranslate[0x80] = false;
      notranslate[0x81] = false;
      notranslate[0x82] = false;
      notranslate[0x83] = false;
      notranslate[0x84] = false;
      notranslate[0x85] = false;
      notranslate[0x86] = false;
      notranslate[0x87] = false;
      notranslate[0x68] = false;
      notranslate[0x69] = false;
      notranslate[0x6a] = false;
      notranslate[0x6b] = false;
      notranslate[0x6c] = false;
      notranslate[0x6d] = false;
      notranslate[0x6e] = false;
      notranslate[0x6f] = false;
      notranslate[0x70] = false;
      notranslate[0x71] = false;
      notranslate[0x72] = false;
      notranslate[0x73] = false;
      notranslate[0x74] = false;
      notranslate[0x75] = false;
      notranslate[0x76] = false;
      notranslate[0x77] = false;
      notranslate[0x58] = false;
      notranslate[0x59] = false;
      notranslate[0x5a] = false;
      notranslate[0x5b] = false;
      notranslate[0x5c] = false;
      notranslate[0x5d] = false;
      notranslate[0x5e] = false;
      notranslate[0x5f] = false;
      notranslate[0x60] = false;
      notranslate[0x61] = false;
      notranslate[0x62] = false;
      notranslate[99] = false;
      notranslate[100] = false;
      notranslate[0x65] = false;
      notranslate[0x66] = false;
      notranslate[0x67] = false;
      notranslate[0x48] = false;
      notranslate[0x49] = false;
      notranslate[0x4a] = false;
      notranslate[0x4b] = false;
      notranslate[0x4c] = false;
      notranslate[0x4d] = false;
      notranslate[0x4e] = false;
      notranslate[0x4f] = false;
      notranslate[0x50] = false;
      notranslate[0x51] = false;
      notranslate[0x52] = false;
      notranslate[0x53] = false;
      notranslate[0x54] = false;
      notranslate[0x55] = false;
      notranslate[0x56] = false;
      notranslate[0x57] = false;
      notranslate[0x38] = false;
      notranslate[0x39] = false;
      notranslate[0x3a] = false;
      notranslate[0x3b] = false;
      notranslate[0x3c] = false;
      notranslate[0x3d] = false;
      notranslate[0x3e] = false;
      notranslate[0x3f] = false;
      notranslate[0x40] = false;
      notranslate[0x41] = false;
      notranslate[0x42] = false;
      notranslate[0x43] = false;
      notranslate[0x44] = false;
      notranslate[0x45] = false;
      notranslate[0x46] = false;
      notranslate[0x47] = false;
      notranslate[0x28] = false;
      notranslate[0x29] = false;
      notranslate[0x2a] = false;
      notranslate[0x2b] = false;
      notranslate[0x2c] = false;
      notranslate[0x2d] = false;
      notranslate[0x2e] = false;
      notranslate[0x2f] = false;
      notranslate[0x30] = false;
      notranslate[0x31] = false;
      notranslate[0x32] = false;
      notranslate[0x33] = false;
      notranslate[0x34] = false;
      notranslate[0x35] = false;
      notranslate[0x36] = false;
      notranslate[0x37] = false;
      notranslate[0x18] = false;
      notranslate[0x19] = false;
      notranslate[0x1a] = false;
      notranslate[0x1b] = false;
      notranslate[0x1c] = false;
      notranslate[0x1d] = false;
      notranslate[0x1e] = false;
      notranslate[0x1f] = false;
      notranslate[0x20] = false;
      notranslate[0x21] = false;
      notranslate[0x22] = false;
      notranslate[0x23] = false;
      notranslate[0x24] = false;
      notranslate[0x25] = false;
      notranslate[0x26] = false;
      notranslate[0x27] = false;
      notranslate[8] = false;
      notranslate[9] = false;
      notranslate[10] = false;
      notranslate[0xb] = false;
      notranslate[0xc] = false;
      notranslate[0xd] = false;
      notranslate[0xe] = false;
      notranslate[0xf] = false;
      notranslate[0x10] = false;
      notranslate[0x11] = false;
      notranslate[0x12] = false;
      notranslate[0x13] = false;
      notranslate[0x14] = false;
      notranslate[0x15] = false;
      notranslate[0x16] = false;
      notranslate[0x17] = false;
      namebuffer.Chars = (char *)0x0;
      notranslate[0] = false;
      notranslate[1] = false;
      notranslate[2] = false;
      notranslate[3] = false;
      notranslate[4] = false;
      notranslate[5] = false;
      notranslate[6] = false;
      notranslate[7] = false;
      FString::operator=(&local_a10,(char *)lumplist[0xff]);
      first = 0;
      count = 0x21;
      spacewidth = 0x21;
      iStack_a44 = 0xdf;
      local_a48 = -1;
      FScanner::MustGetStringName((FScanner *)(lumplist + 0xff),"{");
      while (bVar1 = FScanner::CheckString((FScanner *)(lumplist + 0xff),"}"),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        FScanner::MustGetString((FScanner *)(lumplist + 0xff));
        bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"TEMPLATE");
        if (bVar1) {
          if (first == 2) goto LAB_0066a96c;
          FScanner::MustGetString((FScanner *)(lumplist + 0xff));
          FString::operator=((FString *)&llump,(char *)lumplist[0xff]);
          first = 1;
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"BASE");
          if (bVar1) {
            if (first == 2) goto LAB_0066a96c;
            FScanner::MustGetNumber((FScanner *)(lumplist + 0xff));
            count = sc.StringLen;
            first = 1;
          }
          else {
            bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"FIRST");
            if (bVar1) {
              if (first == 2) goto LAB_0066a96c;
              FScanner::MustGetNumber((FScanner *)(lumplist + 0xff));
              spacewidth = sc.StringLen;
              first = 1;
            }
            else {
              bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"COUNT");
              if (bVar1) {
                if (first == 2) goto LAB_0066a96c;
                FScanner::MustGetNumber((FScanner *)(lumplist + 0xff));
                iStack_a44 = sc.StringLen;
                first = 1;
              }
              else {
                bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"CURSOR");
                if (bVar1) {
                  FScanner::MustGetString((FScanner *)(lumplist + 0xff));
                  p._7_1_ = *(char *)&lumplist[0xff]->_vptr_FTexture;
                }
                else {
                  bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"SPACEWIDTH");
                  if (bVar1) {
                    if (first == 2) goto LAB_0066a96c;
                    FScanner::MustGetNumber((FScanner *)(lumplist + 0xff));
                    local_a48 = sc.StringLen;
                    first = 1;
                  }
                  else {
                    bVar1 = FScanner::Compare((FScanner *)(lumplist + 0xff),"NOTRANSLATION");
                    if (bVar1) {
                      if (first == 1) goto LAB_0066a96c;
                      while( true ) {
                        bVar1 = FScanner::CheckNumber((FScanner *)(lumplist + 0xff));
                        local_aa2 = 0;
                        if (bVar1) {
                          local_aa2 = sc.Name.Index._1_1_ ^ 0xff;
                        }
                        if ((local_aa2 & 1) == 0) break;
                        if ((-1 < sc.StringLen) && (sc.StringLen < 0x100)) {
                          notranslate[(long)sc.StringLen + -8] = true;
                        }
                      }
                    }
                    else {
                      if (first == 1) goto LAB_0066a96c;
                      ppFStack_a58 = lumplist +
                                     ((ulong)*(byte *)&lumplist[0xff]->_vptr_FTexture - 1);
                      FScanner::MustGetString((FScanner *)(lumplist + 0xff));
                      fnt._4_4_ = FTextureManager::CheckForTexture
                                            (&TexMan,(char *)lumplist[0xff],8,1);
                      bVar1 = FTextureID::Exists((FTextureID *)((long)&fnt + 4));
                      if (bVar1) {
                        fnt._0_4_ = fnt._4_4_;
                        pFVar3 = FTextureManager::operator[](&TexMan,fnt._4_4_);
                        *ppFStack_a58 = pFVar3;
                      }
                      else {
                        iVar2 = FWadCollection::GetLumpFile(&Wads,sc.Line);
                        pFVar3 = lumplist[0xff];
                        if (0 < iVar2) {
                          FString::GetChars(&local_a10);
                          FScanner::ScriptMessage
                                    ((FScanner *)(lumplist + 0xff),
                                     "%s: Unable to find texture in font definition for %s",pFVar3);
                        }
                      }
                    }
                    first = 2;
                  }
                }
              }
            }
          }
        }
      }
      if (first == 1) {
        this = (FFont *)operator_new(0x60);
        pcVar4 = FString::operator_cast_to_char_(&local_a10);
        nametemplate = FString::operator_cast_to_char_((FString *)&llump);
        FFont::FFont(this,pcVar4,nametemplate,spacewidth,iStack_a44,count,format,local_a48);
        FFont::SetCursor(this,p._7_1_);
      }
      else {
        if (first != 2) {
LAB_0066a96c:
          pcVar4 = FString::GetChars(&local_a10);
          FScanner::ScriptError
                    ((FScanner *)(lumplist + 0xff),
                     "Invalid combination of properties in font \'%s\'",pcVar4);
          goto LAB_0066a9a9;
        }
        for (lastlump = 0; lastlump < 0x100; lastlump = lastlump + 1) {
          if (lumplist[(long)lastlump + -1] != (FTexture *)0x0) {
            spacewidth = lastlump;
            break;
          }
        }
        for (lastlump = 0xff; -1 < lastlump; lastlump = lastlump + -1) {
          if (lumplist[(long)lastlump + -1] != (FTexture *)0x0) {
            iStack_a44 = (lastlump - spacewidth) + 1;
            break;
          }
        }
        if (0 < iStack_a44) {
          this_00 = (FSpecialFont *)operator_new(0x160);
          pcVar4 = FString::operator_cast_to_char_(&local_a10);
          FSpecialFont::FSpecialFont
                    (this_00,pcVar4,spacewidth,iStack_a44,lumplist + (long)spacewidth + -1,
                     (bool *)&namebuffer,format);
          FFont::SetCursor((FFont *)this_00,p._7_1_);
        }
      }
    }
    FScanner::Close((FScanner *)(lumplist + 0xff));
  } while( true );
}

Assistant:

void V_InitCustomFonts()
{
	FScanner sc;
	FTexture *lumplist[256];
	bool notranslate[256];
	FString namebuffer, templatebuf;
	int i;
	int llump,lastlump=0;
	int format;
	int start;
	int first;
	int count;
	int spacewidth;
	char cursor = '_';

	while ((llump = Wads.FindLump ("FONTDEFS", &lastlump)) != -1)
	{
		sc.OpenLumpNum(llump);
		while (sc.GetString())
		{
			memset (lumplist, 0, sizeof(lumplist));
			memset (notranslate, 0, sizeof(notranslate));
			namebuffer = sc.String;
			format = 0;
			start = 33;
			first = 33;
			count = 223;
			spacewidth = -1;

			sc.MustGetStringName ("{");
			while (!sc.CheckString ("}"))
			{
				sc.MustGetString();
				if (sc.Compare ("TEMPLATE"))
				{
					if (format == 2) goto wrong;
					sc.MustGetString();
					templatebuf = sc.String;
					format = 1;
				}
				else if (sc.Compare ("BASE"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					start = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("FIRST"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					first = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("COUNT"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					count = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("CURSOR"))
				{
					sc.MustGetString();
					cursor = sc.String[0];
				}
				else if (sc.Compare ("SPACEWIDTH"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					spacewidth = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("NOTRANSLATION"))
				{
					if (format == 1) goto wrong;
					while (sc.CheckNumber() && !sc.Crossed)
					{
						if (sc.Number >= 0 && sc.Number < 256)
							notranslate[sc.Number] = true;
					}
					format = 2;
				}
				else
				{
					if (format == 1) goto wrong;
					FTexture **p = &lumplist[*(unsigned char*)sc.String];
					sc.MustGetString();
					FTextureID texid = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
					if (texid.Exists())
					{
						*p = TexMan[texid];
					}
					else if (Wads.GetLumpFile(sc.LumpNum) >= Wads.IWAD_FILENUM)
					{
						// Print a message only if this isn't in zdoom.pk3
						sc.ScriptMessage("%s: Unable to find texture in font definition for %s", sc.String, namebuffer.GetChars());
					}
					format = 2;
				}
			}
			if (format == 1)
			{
				FFont *fnt = new FFont (namebuffer, templatebuf, first, count, start, llump, spacewidth);
				fnt->SetCursor(cursor);
			}
			else if (format == 2)
			{
				for (i = 0; i < 256; i++)
				{
					if (lumplist[i] != NULL)
					{
						first = i;
						break;
					}
				}
				for (i = 255; i >= 0; i--)
				{
					if (lumplist[i] != NULL)
					{
						count = i - first + 1;
						break;
					}
				}
				if (count > 0)
				{
					FFont *fnt = new FSpecialFont (namebuffer, first, count, &lumplist[first], notranslate, llump);
					fnt->SetCursor(cursor);
				}
			}
			else goto wrong;
		}
		sc.Close();
	}
	return;

wrong:
	sc.ScriptError ("Invalid combination of properties in font '%s'", namebuffer.GetChars());
}